

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFFFundamentalParameterData.cpp
# Opt level: O0

int __thiscall
DIS::IFFFundamentalParameterData::getMarshalledSize(IFFFundamentalParameterData *this)

{
  int marshalSize;
  IFFFundamentalParameterData *this_local;
  
  return 0x18;
}

Assistant:

int IFFFundamentalParameterData::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 4;  // _erp
   marshalSize = marshalSize + 4;  // _frequency
   marshalSize = marshalSize + 4;  // _pgrf
   marshalSize = marshalSize + 4;  // _pulseWidth
   marshalSize = marshalSize + 4;  // _burstLength
   marshalSize = marshalSize + 1;  // _applicableModes
   marshalSize = marshalSize + 3 * 1;  // _systemSpecificData
    return marshalSize;
}